

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,CacheId cacheId)

{
  bool bVar1;
  unsigned_short local_2e;
  unsigned_short uStack_2c;
  unsigned_short uStack_2a;
  CacheId CStack_28;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  CacheId cacheId_local;
  RegSlot instance_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  CStack_28 = cacheId;
  layout._2_4_ = instance;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>(&local_2e,value);
  if (((bVar1) &&
      (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                         (&uStack_2c,layout._2_4_), bVar1)) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                        (&uStack_2a,CStack_28), bVar1)) {
    Data::EncodeT<(Js::LayoutSize)1>(&this->m_byteCodeData,op,&local_2e,6,this);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteElementCP(OpCode op, RegSlot value, RegSlot instance, CacheId cacheId)
    {
        OpLayoutT_ElementCP<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value) && SizePolicy::Assign(layout.Instance, instance)
            && SizePolicy::Assign(layout.inlineCacheIndex, cacheId))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }